

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly_test.c
# Opt level: O1

void test_poly_identity(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *local_38;
  char *n;
  uint16_t p;
  nng_socket s;
  
  nVar1 = nng_pair1_open_poly((nng_socket *)((long)&n + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x1b,"%s: expected success, got %s (%d)","nng_pair1_open_poly(&s)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_socket_proto_id(n._4_4_,(uint16_t *)((long)&n + 2));
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                           ,0x1c,"%s: expected success, got %s (%d)","nng_socket_proto_id(s, &p)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      acutest_check_((uint)(n._2_2_ == 0x11),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                     ,0x1d,"%s","p == NUTS_PROTO(1u, 1u)");
      nVar1 = nng_socket_peer_id(n._4_4_,(uint16_t *)((long)&n + 2));
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                             ,0x1e,"%s: expected success, got %s (%d)","nng_socket_peer_id(s, &p)",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        acutest_check_((uint)(n._2_2_ == 0x11),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                       ,0x1f,"%s","p == NUTS_PROTO(1u, 1u)");
        nVar1 = nng_socket_proto_name(n._4_4_,&local_38);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                               ,0x20,"%s: expected success, got %s (%d)",
                               "nng_socket_proto_name(s, &n)",pcVar3,nVar1);
        pcVar3 = local_38;
        if (iVar2 != 0) {
          iVar2 = strcmp(local_38,"pair1");
          acutest_check_((uint)(iVar2 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x21,"%s == %s",pcVar3,"pair1",nVar1);
          nVar1 = nng_socket_peer_name(n._4_4_,&local_38);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                 ,0x22,"%s: expected success, got %s (%d)",
                                 "nng_socket_peer_name(s, &n)",pcVar3,nVar1);
          if (iVar2 != 0) {
            iVar2 = strcmp(local_38,"pair1");
            acutest_check_((uint)(iVar2 == 0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                           ,0x23,"%s == %s",local_38,"pair1",nVar1);
            nVar1 = nng_socket_close(n._4_4_);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                   ,0x24,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_poly_identity(void)
{
	nng_socket  s;
	uint16_t    p;
	const char *n;

	NUTS_PASS(nng_pair1_open_poly(&s));
	NUTS_PASS(nng_socket_proto_id(s, &p));
	NUTS_TRUE(p == NUTS_PROTO(1u, 1u)); // 32
	NUTS_PASS(nng_socket_peer_id(s, &p));
	NUTS_TRUE(p == NUTS_PROTO(1u, 1u)); // 33
	NUTS_PASS(nng_socket_proto_name(s, &n));
	NUTS_MATCH(n, "pair1");
	NUTS_PASS(nng_socket_peer_name(s, &n));
	NUTS_MATCH(n, "pair1");
	NUTS_CLOSE(s);
}